

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.h
# Opt level: O2

shared_ptr<vmips::VirtReg> __thiscall
vmips::Function::call<std::shared_ptr<vmips::VirtReg>&>
          (Function *this,weak_ptr<vmips::Function> *target,shared_ptr<vmips::VirtReg> *args)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  __shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2> *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<vmips::VirtReg> sVar4;
  initializer_list<std::shared_ptr<vmips::VirtReg>_> __l;
  allocator_type local_69;
  vector<std::shared_ptr<vmips::VirtReg>,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>
  local_68;
  undefined1 local_50 [8];
  shared_ptr<vmips::callfunc> calling;
  __shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  vmips::VirtReg::create();
  *(undefined1 *)
   &target[0x10].super___weak_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = 1
  ;
  std::__shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2> *)&local_68,args);
  peVar1 = target[0x11].super___weak_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar3 = *(element_type **)
            ((long)local_68.
                   super__Vector_base<std::shared_ptr<vmips::VirtReg>,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 0x128);
  if (*(element_type **)
       ((long)local_68.
              super__Vector_base<std::shared_ptr<vmips::VirtReg>,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 0x128) < peVar1) {
    peVar3 = peVar1;
  }
  target[0x11].super___weak_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_68.
              super__Vector_base<std::shared_ptr<vmips::VirtReg>,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  local_50 = (undefined1  [8])target;
  std::__shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_38,in_RCX);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_38;
  std::vector<std::shared_ptr<vmips::VirtReg>,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>::
  vector(&local_68,__l,&local_69);
  std::
  make_shared<vmips::callfunc,std::shared_ptr<vmips::VirtReg>&,vmips::Function*,std::weak_ptr<vmips::Function>,std::vector<std::shared_ptr<vmips::VirtReg>,std::allocator<std::shared_ptr<vmips::VirtReg>>>>
            ((shared_ptr<vmips::VirtReg> *)&calling,(Function **)this,
             (weak_ptr<vmips::Function> *)local_50,
             (vector<std::shared_ptr<vmips::VirtReg>,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>
              *)args);
  std::vector<std::shared_ptr<vmips::VirtReg>,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>::
  ~vector(&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  p_Var2 = target[0x14].super___weak_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  std::__shared_ptr<vmips::Instruction,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<vmips::callfunc,void>
            ((__shared_ptr<vmips::Instruction,(__gnu_cxx::_Lock_policy)2> *)&local_68,
             &calling.super___shared_ptr<vmips::callfunc,_(__gnu_cxx::_Lock_policy)2>);
  std::
  vector<std::shared_ptr<vmips::Instruction>,std::allocator<std::shared_ptr<vmips::Instruction>>>::
  emplace_back<std::shared_ptr<vmips::Instruction>>
            ((vector<std::shared_ptr<vmips::Instruction>,std::allocator<std::shared_ptr<vmips::Instruction>>>
              *)(p_Var2 + 3),(shared_ptr<vmips::Instruction> *)&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_68.
              super__Vector_base<std::shared_ptr<vmips::VirtReg>,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&calling.super___shared_ptr<vmips::callfunc,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  sVar4.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar4.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<vmips::VirtReg>)
         sVar4.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<VirtReg> call(std::weak_ptr<Function> target, Args &&... args) {
            auto ret = VirtReg::create();
            has_sub = true;
            sub_argc = std::max(sub_argc, target.lock()->argc);
            auto calling = std::make_shared<callfunc>(ret, this, std::move(target),
                                                      std::vector<std::shared_ptr<VirtReg >>{
                                                              std::forward<Args>(args)...});
            cursor->instructions.push_back(calling);
            return ret;
        }